

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# possible-contents.cpp
# Opt level: O3

void __thiscall
PossibleContentsTest_TestIntersectWithCombinations_Test::TestBody
          (PossibleContentsTest_TestIntersectWithCombinations_Test *this)

{
  __node_base_ptr *this_00;
  undefined8 extraout_RDX;
  unordered_set<wasm::PossibleContents,_std::hash<wasm::PossibleContents>,_std::equal_to<wasm::PossibleContents>,_std::allocator<wasm::PossibleContents>_>
  *set;
  unordered_set<wasm::PossibleContents,_std::hash<wasm::PossibleContents>,_std::equal_to<wasm::PossibleContents>,_std::allocator<wasm::PossibleContents>_>
  *set_00;
  long lVar1;
  initializer_list<wasm::Field> __l;
  Array AVar2;
  undefined1 auStack_498 [8];
  unordered_set<wasm::PossibleContents,_std::hash<wasm::PossibleContents>,_std::equal_to<wasm::PossibleContents>,_std::allocator<wasm::PossibleContents>_>
  subsequent;
  _Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  local_458;
  _Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  local_438;
  _Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  local_418;
  _Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  local_3f8;
  _Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  local_3d8;
  _Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  local_3b8;
  _Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  local_398;
  _Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  local_378;
  _Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  local_358;
  _Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  local_338;
  _Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  local_318;
  _Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  local_2f8;
  _Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  local_2d8;
  _Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  local_2b8;
  _Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  local_298;
  _Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  local_278;
  _Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  local_258;
  _Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  local_238;
  _Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  local_218;
  _Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  local_1f8;
  _Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  local_1d8;
  _Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  local_1b8;
  _Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  local_198;
  _Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  local_178;
  undefined1 local_158 [8];
  undefined8 local_150;
  undefined8 local_148;
  _Hashtable<wasm::PossibleContents,_wasm::PossibleContents,_std::allocator<wasm::PossibleContents>,_std::__detail::_Identity,_std::equal_to<wasm::PossibleContents>,_std::hash<wasm::PossibleContents>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_140;
  undefined1 local_108 [8];
  unordered_set<wasm::PossibleContents,_std::hash<wasm::PossibleContents>,_std::equal_to<wasm::PossibleContents>,_std::allocator<wasm::PossibleContents>_>
  initial;
  HeapType local_98;
  Field local_90;
  HeapType local_80;
  _AllocNode<std::allocator<std::__detail::_Hash_node<wasm::PossibleContents,_true>_>_> _Stack_78;
  __node_gen_type __node_gen;
  __node_base local_68;
  Type local_40;
  Type structType;
  Type arrayType;
  
  std::__detail::__variant::
  _Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)auStack_498,
                    (_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)&(this->super_PossibleContentsTest).none);
  std::__detail::__variant::
  _Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)&subsequent._M_h._M_element_count,
                    (_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)&(this->super_PossibleContentsTest).f64One);
  std::__detail::__variant::
  _Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::_Copy_ctor_base(&local_458,
                    (_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)&(this->super_PossibleContentsTest).anyNull);
  std::__detail::__variant::
  _Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::_Copy_ctor_base(&local_438,
                    (_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)&(this->super_PossibleContentsTest).funcNull);
  std::__detail::__variant::
  _Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::_Copy_ctor_base(&local_418,
                    (_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)&(this->super_PossibleContentsTest).i31Null);
  std::__detail::__variant::
  _Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::_Copy_ctor_base(&local_3f8,
                    (_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)&(this->super_PossibleContentsTest).i32Global1);
  std::__detail::__variant::
  _Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::_Copy_ctor_base(&local_3d8,
                    (_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)&(this->super_PossibleContentsTest).i32Global2);
  std::__detail::__variant::
  _Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::_Copy_ctor_base(&local_3b8,
                    (_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)&(this->super_PossibleContentsTest).f64Global);
  std::__detail::__variant::
  _Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::_Copy_ctor_base(&local_398,
                    (_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)&(this->super_PossibleContentsTest).anyGlobal);
  std::__detail::__variant::
  _Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::_Copy_ctor_base(&local_378,
                    (_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)&(this->super_PossibleContentsTest).funcGlobal);
  std::__detail::__variant::
  _Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::_Copy_ctor_base(&local_358,
                    (_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)&(this->super_PossibleContentsTest).nonNullFuncGlobal);
  std::__detail::__variant::
  _Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::_Copy_ctor_base(&local_338,
                    (_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)&(this->super_PossibleContentsTest).nonNullFunc);
  std::__detail::__variant::
  _Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::_Copy_ctor_base(&local_318,
                    (_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)&(this->super_PossibleContentsTest).exactI32);
  std::__detail::__variant::
  _Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::_Copy_ctor_base(&local_2f8,
                    (_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)&(this->super_PossibleContentsTest).exactAnyref);
  std::__detail::__variant::
  _Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::_Copy_ctor_base(&local_2d8,
                    (_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)&(this->super_PossibleContentsTest).exactFuncref);
  std::__detail::__variant::
  _Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::_Copy_ctor_base(&local_2b8,
                    (_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)&(this->super_PossibleContentsTest).exactStructref);
  std::__detail::__variant::
  _Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::_Copy_ctor_base(&local_298,
                    (_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)&(this->super_PossibleContentsTest).exactI31ref);
  std::__detail::__variant::
  _Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::_Copy_ctor_base(&local_278,
                    (_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)&(this->super_PossibleContentsTest).exactNonNullAnyref);
  std::__detail::__variant::
  _Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::_Copy_ctor_base(&local_258,
                    (_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)&(this->super_PossibleContentsTest).exactNonNullFuncref);
  std::__detail::__variant::
  _Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::_Copy_ctor_base(&local_238,
                    (_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)&(this->super_PossibleContentsTest).exactNonNullI31ref);
  std::__detail::__variant::
  _Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::_Copy_ctor_base(&local_218,
                    (_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)&(this->super_PossibleContentsTest).exactFuncSignatureType);
  std::__detail::__variant::
  _Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::_Copy_ctor_base(&local_1f8,
                    (_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)&(this->super_PossibleContentsTest).exactNonNullFuncSignatureType);
  std::__detail::__variant::
  _Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::_Copy_ctor_base(&local_1d8,
                    (_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)&(this->super_PossibleContentsTest).many);
  std::__detail::__variant::
  _Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::_Copy_ctor_base(&local_1b8,
                    (_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)&(this->super_PossibleContentsTest).coneAnyref);
  std::__detail::__variant::
  _Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::_Copy_ctor_base(&local_198,
                    (_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)&(this->super_PossibleContentsTest).coneFuncref);
  std::__detail::__variant::
  _Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::_Copy_ctor_base(&local_178,
                    (_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     *)&(this->super_PossibleContentsTest).coneFuncref1);
  std::
  _Hashtable<wasm::PossibleContents,wasm::PossibleContents,std::allocator<wasm::PossibleContents>,std::__detail::_Identity,std::equal_to<wasm::PossibleContents>,std::hash<wasm::PossibleContents>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::_Hashtable<wasm::PossibleContents_const*>
            ((_Hashtable<wasm::PossibleContents,wasm::PossibleContents,std::allocator<wasm::PossibleContents>,std::__detail::_Identity,std::equal_to<wasm::PossibleContents>,std::hash<wasm::PossibleContents>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)local_108,auStack_498,local_158,0,&stack0xffffffffffffff88,&local_90,&local_40);
  lVar1 = 800;
  do {
    std::__detail::__variant::
    _Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
    ::~_Variant_storage((_Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                         *)(auStack_498 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  local_90.type.id = 2;
  local_90.packedType = not_packed;
  local_90.mutable_ = Immutable;
  __l._M_len = 1;
  __l._M_array = &local_90;
  std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector
            ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)&stack0xffffffffffffff88,__l,
             (allocator_type *)&structType);
  auStack_498 = (undefined1  [8])_Stack_78._M_h;
  subsequent._M_h._M_buckets = (__buckets_ptr)__node_gen._M_h;
  subsequent._M_h._M_bucket_count = (size_type)local_68._M_nxt;
  _Stack_78._M_h = (__hashtable_alloc *)0x0;
  __node_gen._M_h = (__hashtable_alloc *)0x0;
  wasm::HeapType::HeapType(&local_98,(Struct *)auStack_498);
  wasm::Type::Type(&local_40,local_98,NonNullable);
  if (auStack_498 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_498,subsequent._M_h._M_bucket_count - (long)auStack_498);
  }
  if ((pointer)_Stack_78._M_h != (pointer)0x0) {
    operator_delete(_Stack_78._M_h,-(long)_Stack_78._M_h);
  }
  auStack_498 = (undefined1  [8])local_40.id;
  subsequent._M_h._M_buckets =
       (__buckets_ptr)((ulong)subsequent._M_h._M_buckets & 0xffffffff00000000);
  subsequent._M_h._M_before_begin._M_nxt._0_1_ = 3;
  _Stack_78._M_h = (__hashtable_alloc *)local_108;
  std::
  _Hashtable<wasm::PossibleContents,wasm::PossibleContents,std::allocator<wasm::PossibleContents>,std::__detail::_Identity,std::equal_to<wasm::PossibleContents>,std::hash<wasm::PossibleContents>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::
  _M_insert<wasm::PossibleContents,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::PossibleContents,true>>>>
            ((_Hashtable<wasm::PossibleContents,wasm::PossibleContents,std::allocator<wasm::PossibleContents>,std::__detail::_Identity,std::equal_to<wasm::PossibleContents>,std::hash<wasm::PossibleContents>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)local_108);
  std::__detail::__variant::
  _Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::~_Variant_storage((_Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                       *)auStack_498);
  local_150 = 2;
  local_148 = 0;
  AVar2.element.packedType = (int)extraout_RDX;
  AVar2.element.mutable_ = (int)((ulong)extraout_RDX >> 0x20);
  AVar2.element.type.id = (uintptr_t)&local_150;
  wasm::HeapType::HeapType(&local_80,AVar2);
  wasm::Type::Type(&structType,local_80,NonNullable);
  auStack_498 = (undefined1  [8])structType.id;
  subsequent._M_h._M_buckets =
       (__buckets_ptr)((ulong)subsequent._M_h._M_buckets & 0xffffffff00000000);
  subsequent._M_h._M_before_begin._M_nxt._0_1_ = 3;
  _Stack_78._M_h = (__hashtable_alloc *)local_108;
  std::
  _Hashtable<wasm::PossibleContents,wasm::PossibleContents,std::allocator<wasm::PossibleContents>,std::__detail::_Identity,std::equal_to<wasm::PossibleContents>,std::hash<wasm::PossibleContents>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::
  _M_insert<wasm::PossibleContents,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::PossibleContents,true>>>>
            ((_Hashtable<wasm::PossibleContents,wasm::PossibleContents,std::allocator<wasm::PossibleContents>,std::__detail::_Identity,std::equal_to<wasm::PossibleContents>,std::hash<wasm::PossibleContents>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)local_108);
  std::__detail::__variant::
  _Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::~_Variant_storage((_Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                       *)auStack_498);
  _Stack_78._M_h = (__hashtable_alloc *)&local_140;
  local_140._M_buckets = (__buckets_ptr)0x0;
  local_140._M_bucket_count = (size_type)initial._M_h._M_buckets;
  local_140._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_140._M_element_count = (size_type)initial._M_h._M_before_begin._M_nxt;
  local_140._M_rehash_policy._0_8_ = initial._M_h._M_element_count;
  local_140._M_rehash_policy._M_next_resize = initial._M_h._M_rehash_policy._0_8_;
  local_140._M_single_bucket = (__node_base_ptr)0x0;
  std::
  _Hashtable<wasm::PossibleContents,wasm::PossibleContents,std::allocator<wasm::PossibleContents>,std::__detail::_Identity,std::equal_to<wasm::PossibleContents>,std::hash<wasm::PossibleContents>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::
  _M_assign<std::_Hashtable<wasm::PossibleContents,wasm::PossibleContents,std::allocator<wasm::PossibleContents>,std::__detail::_Identity,std::equal_to<wasm::PossibleContents>,std::hash<wasm::PossibleContents>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::PossibleContents,true>>>>
            ((_Hashtable<wasm::PossibleContents,wasm::PossibleContents,std::allocator<wasm::PossibleContents>,std::__detail::_Identity,std::equal_to<wasm::PossibleContents>,std::hash<wasm::PossibleContents>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)_Stack_78._M_h,
             (_Hashtable<wasm::PossibleContents,_wasm::PossibleContents,_std::allocator<wasm::PossibleContents>,_std::__detail::_Identity,_std::equal_to<wasm::PossibleContents>,_std::hash<wasm::PossibleContents>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              *)local_108,&stack0xffffffffffffff88);
  TestBody::anon_class_1_0_00000001::operator()
            ((unordered_set<wasm::PossibleContents,_std::hash<wasm::PossibleContents>,_std::equal_to<wasm::PossibleContents>,_std::allocator<wasm::PossibleContents>_>
              *)auStack_498,(anon_class_1_0_00000001 *)&local_140,set);
  std::
  _Hashtable<wasm::PossibleContents,_wasm::PossibleContents,_std::allocator<wasm::PossibleContents>,_std::__detail::_Identity,_std::equal_to<wasm::PossibleContents>,_std::hash<wasm::PossibleContents>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_140);
  if (initial._M_h._M_before_begin._M_nxt <
      (_Hash_node_base *)
      CONCAT71(subsequent._M_h._M_before_begin._M_nxt._1_7_,
               subsequent._M_h._M_before_begin._M_nxt._0_1_)) {
    this_00 = &initial._M_h._M_single_bucket;
    do {
      std::
      _Hashtable<wasm::PossibleContents,wasm::PossibleContents,std::allocator<wasm::PossibleContents>,std::__detail::_Identity,std::equal_to<wasm::PossibleContents>,std::hash<wasm::PossibleContents>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_assign_elements<std::_Hashtable<wasm::PossibleContents,wasm::PossibleContents,std::allocator<wasm::PossibleContents>,std::__detail::_Identity,std::equal_to<wasm::PossibleContents>,std::hash<wasm::PossibleContents>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&>
                ((_Hashtable<wasm::PossibleContents,wasm::PossibleContents,std::allocator<wasm::PossibleContents>,std::__detail::_Identity,std::equal_to<wasm::PossibleContents>,std::hash<wasm::PossibleContents>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)local_108,
                 (_Hashtable<wasm::PossibleContents,_wasm::PossibleContents,_std::allocator<wasm::PossibleContents>,_std::__detail::_Identity,_std::equal_to<wasm::PossibleContents>,_std::hash<wasm::PossibleContents>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  *)auStack_498);
      initial._M_h._M_single_bucket = (__node_base_ptr)0x0;
      local_90.type.id = (uintptr_t)this_00;
      std::
      _Hashtable<wasm::PossibleContents,wasm::PossibleContents,std::allocator<wasm::PossibleContents>,std::__detail::_Identity,std::equal_to<wasm::PossibleContents>,std::hash<wasm::PossibleContents>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_assign<std::_Hashtable<wasm::PossibleContents,wasm::PossibleContents,std::allocator<wasm::PossibleContents>,std::__detail::_Identity,std::equal_to<wasm::PossibleContents>,std::hash<wasm::PossibleContents>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::PossibleContents,true>>>>
                ((_Hashtable<wasm::PossibleContents,wasm::PossibleContents,std::allocator<wasm::PossibleContents>,std::__detail::_Identity,std::equal_to<wasm::PossibleContents>,std::hash<wasm::PossibleContents>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)this_00,
                 (_Hashtable<wasm::PossibleContents,_wasm::PossibleContents,_std::allocator<wasm::PossibleContents>,_std::__detail::_Identity,_std::equal_to<wasm::PossibleContents>,_std::hash<wasm::PossibleContents>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  *)auStack_498,
                 (_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::PossibleContents,_true>_>_>
                  *)&local_90);
      TestBody::anon_class_1_0_00000001::operator()
                ((unordered_set<wasm::PossibleContents,_std::hash<wasm::PossibleContents>,_std::equal_to<wasm::PossibleContents>,_std::allocator<wasm::PossibleContents>_>
                  *)&stack0xffffffffffffff88,(anon_class_1_0_00000001 *)this_00,set_00);
      std::
      _Hashtable<wasm::PossibleContents,_wasm::PossibleContents,_std::allocator<wasm::PossibleContents>,_std::__detail::_Identity,_std::equal_to<wasm::PossibleContents>,_std::hash<wasm::PossibleContents>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::_M_move_assign((_Hashtable<wasm::PossibleContents,_wasm::PossibleContents,_std::allocator<wasm::PossibleContents>,_std::__detail::_Identity,_std::equal_to<wasm::PossibleContents>,_std::hash<wasm::PossibleContents>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                        *)auStack_498,
                       (_Hashtable<wasm::PossibleContents,_wasm::PossibleContents,_std::allocator<wasm::PossibleContents>,_std::__detail::_Identity,_std::equal_to<wasm::PossibleContents>,_std::hash<wasm::PossibleContents>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                        *)&stack0xffffffffffffff88);
      std::
      _Hashtable<wasm::PossibleContents,_wasm::PossibleContents,_std::allocator<wasm::PossibleContents>,_std::__detail::_Identity,_std::equal_to<wasm::PossibleContents>,_std::hash<wasm::PossibleContents>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable((_Hashtable<wasm::PossibleContents,_wasm::PossibleContents,_std::allocator<wasm::PossibleContents>,_std::__detail::_Identity,_std::equal_to<wasm::PossibleContents>,_std::hash<wasm::PossibleContents>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     *)&stack0xffffffffffffff88);
      std::
      _Hashtable<wasm::PossibleContents,_wasm::PossibleContents,_std::allocator<wasm::PossibleContents>,_std::__detail::_Identity,_std::equal_to<wasm::PossibleContents>,_std::hash<wasm::PossibleContents>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable((_Hashtable<wasm::PossibleContents,_wasm::PossibleContents,_std::allocator<wasm::PossibleContents>,_std::__detail::_Identity,_std::equal_to<wasm::PossibleContents>,_std::hash<wasm::PossibleContents>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     *)this_00);
    } while (initial._M_h._M_before_begin._M_nxt <
             (_Hash_node_base *)
             CONCAT71(subsequent._M_h._M_before_begin._M_nxt._1_7_,
                      subsequent._M_h._M_before_begin._M_nxt._0_1_));
  }
  std::
  _Hashtable<wasm::PossibleContents,_wasm::PossibleContents,_std::allocator<wasm::PossibleContents>,_std::__detail::_Identity,_std::equal_to<wasm::PossibleContents>,_std::hash<wasm::PossibleContents>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<wasm::PossibleContents,_wasm::PossibleContents,_std::allocator<wasm::PossibleContents>,_std::__detail::_Identity,_std::equal_to<wasm::PossibleContents>,_std::hash<wasm::PossibleContents>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)auStack_498);
  std::
  _Hashtable<wasm::PossibleContents,_wasm::PossibleContents,_std::allocator<wasm::PossibleContents>,_std::__detail::_Identity,_std::equal_to<wasm::PossibleContents>,_std::hash<wasm::PossibleContents>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<wasm::PossibleContents,_wasm::PossibleContents,_std::allocator<wasm::PossibleContents>,_std::__detail::_Identity,_std::equal_to<wasm::PossibleContents>,_std::hash<wasm::PossibleContents>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)local_108);
  return;
}

Assistant:

TEST_F(PossibleContentsTest, TestIntersectWithCombinations) {
  // Whenever we combine C = A + B, both A and B must intersect with C. This
  // helper function gets a set of things and checks that property on them. It
  // returns the set of all contents it ever observed (see below for how we use
  // that).
  auto doTest = [](std::unordered_set<PossibleContents> set) {
    std::vector<PossibleContents> vec(set.begin(), set.end());

    // Find the maximum depths for the normalized cone tests later down.
    std::unordered_set<HeapType> heapTypes;
    for (auto& contents : set) {
      auto type = contents.getType();
      if (type.isRef()) {
        auto heapType = type.getHeapType();
        if (!heapType.isBasic()) {
          heapTypes.insert(heapType);
        }
      }
    }
    std::vector<HeapType> heapTypesVec(heapTypes.begin(), heapTypes.end());
    SubTypes subTypes(heapTypesVec);
    auto maxDepths = subTypes.getMaxDepths();

    // Go over all permutations up to a certain size (this quickly becomes
    // extremely slow, obviously, so keep this low).
    size_t max = 3;

    auto n = set.size();

    // |indexes| contains the indexes of the items in vec for the current
    // permutation.
    std::vector<size_t> indexes(max);
    std::fill(indexes.begin(), indexes.end(), 0);
    while (1) {
      // Test the current permutation: Combine all the relevant things, and then
      // check they all have an intersection.
      PossibleContents combination;
      for (auto index : indexes) {
        combination.combine(vec[index]);
      }
      // Note the combination in the set.
      set.insert(combination);
#if BINARYEN_TEST_DEBUG
      for (auto index : indexes) {
        std::cout << index << ' ';
        combination.combine(vec[index]);
      }
      std::cout << '\n';
#endif
      for (auto index : indexes) {
        auto item = vec[index];
        if (item.isNone()) {
          assertLackIntersection(combination, item);
          continue;
        }
#if BINARYEN_TEST_DEBUG
        if (!PossibleContents::haveIntersection(combination, item)) {
          std::cout << "\nFailure: no expected intersection. Indexes:\n";
          for (auto index : indexes) {
            std::cout << index << "\n  ";
            vec[index].dump(std::cout);
            std::cout << '\n';
          }
          std::cout << "combo:\n";
          combination.dump(std::cout);
          std::cout << "\ncompared item (index " << index << "):\n";
          item.dump(std::cout);
          std::cout << '\n';
          abort();
        }
#endif
        assertHaveIntersection(combination, item);

        auto type = combination.getType();
        if (type.isRef()) {
          // If we normalize the combination's depth, the item must still have
          // an intersection. That is, normalization must not have a bug that
          // results in cones that are too shallow.
          auto normalizedDepth = maxDepths[type.getHeapType()];
          auto normalizedCone =
            PossibleContents::coneType(type, normalizedDepth);
          assertHaveIntersection(normalizedCone, item);
        }

        // Test intersectWithFullCone() method, which is supported with a full
        // cone type. In that case we can test that the intersection of A with
        // A + B is simply A.
        if (combination.isFullConeType()) {
          auto intersection = item;
          intersection.intersectWithFullCone(combination);
          EXPECT_EQ(intersection, item);
#if BINARYEN_TEST_DEBUG
          if (intersection != item) {
            std::cout << "\nFailure: wrong intersection.\n";
            std::cout << "item: " << item << '\n';
            std::cout << "combination: " << combination << '\n';
            std::cout << "intersection: " << intersection << '\n';
            abort();
          }
#endif

          // The intersection is contained in each of the things we intersected
          // (but we can only compare to the full cone, as the API is restricted
          // to that).
          EXPECT_TRUE(
            PossibleContents::isSubContents(intersection, combination));
        }
      }

      // Move to the next permutation.
      size_t i = 0;
      while (1) {
        indexes[i]++;
        if (indexes[i] == n) {
          // Overflow.
          indexes[i] = 0;
          i++;
          if (i == max) {
            // All done.
            return set;
          }
        } else {
          break;
        }
      }
    }

    WASM_UNREACHABLE("loop above returns manually");
  };

  // Start from an initial set of the hardcoded contents we have in our test
  // fixture.
  std::unordered_set<PossibleContents> initial = {none,
                                                  f64One,
                                                  anyNull,
                                                  funcNull,
                                                  i31Null,
                                                  i32Global1,
                                                  i32Global2,
                                                  f64Global,
                                                  anyGlobal,
                                                  funcGlobal,
                                                  nonNullFuncGlobal,
                                                  nonNullFunc,
                                                  exactI32,
                                                  exactAnyref,
                                                  exactFuncref,
                                                  exactStructref,
                                                  exactI31ref,
                                                  exactNonNullAnyref,
                                                  exactNonNullFuncref,
                                                  exactNonNullI31ref,
                                                  exactFuncSignatureType,
                                                  exactNonNullFuncSignatureType,
                                                  many,
                                                  coneAnyref,
                                                  coneFuncref,
                                                  coneFuncref1};

  // Add some additional interesting types.
  auto structType =
    Type(HeapType(Struct({Field(Type::i32, Immutable)})), NonNullable);
  initial.insert(PossibleContents::coneType(structType, 0));
  auto arrayType =
    Type(HeapType(Array(Field(Type::i32, Immutable))), NonNullable);
  initial.insert(PossibleContents::coneType(arrayType, 0));

  // After testing on the initial contents, also test using anything new that
  // showed up while combining them.
  auto subsequent = doTest(initial);
  while (subsequent.size() > initial.size()) {
    initial = subsequent;
    subsequent = doTest(subsequent);
  }
}